

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

Var Js::CrossSite::MarshalVar(ScriptContext *scriptContext,Var value,bool fRequestWrapper)

{
  bool bVar1;
  ScriptContextPrivilegeLevel SVar2;
  ScriptContextPrivilegeLevel SVar3;
  RecyclableObject *pRVar4;
  ScriptContext *pSVar5;
  JavascriptLibrary *this;
  ScriptContext *objectScriptContext;
  RecyclableObject *object;
  bool fRequestWrapper_local;
  Var value_local;
  ScriptContext *scriptContext_local;
  
  scriptContext_local = (ScriptContext *)value;
  if (((value != (Var)0x0) && (bVar1 = TaggedNumber::Is(value), !bVar1)) &&
     ((pRVar4 = UnsafeVarTo<Js::RecyclableObject>(value), fRequestWrapper ||
      (pSVar5 = RecyclableObject::GetScriptContext(pRVar4), scriptContext != pSVar5)))) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,MarshalPhase);
    if (bVar1) {
      pSVar5 = RecyclableObject::GetScriptContext(pRVar4);
      Output::Print(L"MarshalVar: %p (var sc: %p, request sc: %p, requestWrapper: %d)\n",pRVar4,
                    pSVar5,scriptContext,(ulong)fRequestWrapper);
    }
    bVar1 = JavascriptConversion::IsCallable(pRVar4);
    if (bVar1) {
      pSVar5 = RecyclableObject::GetScriptContext(pRVar4);
      SVar2 = ScriptContext::GetPrivilegeLevel(scriptContext);
      SVar3 = ScriptContext::GetPrivilegeLevel(pSVar5);
      if ((int)SVar2 < (int)SVar3) {
        this = ScriptContext::GetLibrary(scriptContext);
        pRVar4 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
        return pRVar4;
      }
    }
    scriptContext_local = (ScriptContext *)MarshalVarInner(scriptContext,pRVar4,fRequestWrapper);
  }
  return scriptContext_local;
}

Assistant:

Var CrossSite::MarshalVar(ScriptContext* scriptContext, Var value, bool fRequestWrapper)
    {
        // value might be null from disable implicit call
        if (value == nullptr || Js::TaggedNumber::Is(value))
        {
            return value;
        }
        Js::RecyclableObject* object =  UnsafeVarTo<RecyclableObject>(value);

        if (fRequestWrapper || scriptContext != object->GetScriptContext())
        {
            if (PHASE_TRACE1(Js::Phase::MarshalPhase))
            {
                Output::Print(_u("MarshalVar: %p (var sc: %p, request sc: %p, requestWrapper: %d)\n"), object, object->GetScriptContext(), scriptContext, fRequestWrapper);
            }

            // Do not allow marshaling if a callable object is being marshalled into a high privileged
            // script context.
            if (JavascriptConversion::IsCallable(object))
            {
                ScriptContext* objectScriptContext = object->GetScriptContext();
                if (scriptContext->GetPrivilegeLevel() < objectScriptContext->GetPrivilegeLevel())
                {
                    return scriptContext->GetLibrary()->GetUndefined();
                }
            }
            return MarshalVarInner(scriptContext, object, fRequestWrapper);
        }
        return value;
    }